

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_5x5_pack8.h
# Opt level: O3

void ncnn::convdw5x5s2_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  void **ppvVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  float *pfVar27;
  float *pfVar28;
  float *pfVar29;
  float *pfVar30;
  float *pfVar31;
  float *pfVar32;
  float *pfVar33;
  float *pfVar34;
  float *pfVar35;
  float *pfVar36;
  float *pfVar37;
  float *pfVar38;
  float *pfVar39;
  float *pfVar40;
  float *pfVar41;
  float *pfVar42;
  float *pfVar43;
  float *pfVar44;
  float *pfVar45;
  float *pfVar46;
  float *pfVar47;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  int iVar52;
  int iVar53;
  int iVar54;
  void *pvVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  void *pvVar59;
  int iVar60;
  undefined1 (*pauVar61) [32];
  void *pvVar62;
  long lVar63;
  int iVar64;
  long lVar65;
  void *pvVar66;
  void *pvVar67;
  long lVar68;
  void *pvVar69;
  long lVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar79 [32];
  float fVar80;
  float fVar81;
  float fVar82;
  
  iVar52 = bottom_blob->c;
  if (0 < (long)iVar52) {
    iVar53 = top_blob->w;
    iVar54 = top_blob->h;
    lVar65 = (long)((bottom_blob->w - iVar53) * 0x10);
    lVar63 = 0;
    do {
      if (_bias == (Mat *)0x0) {
        fVar73 = 0.0;
        fVar74 = 0.0;
        fVar71 = 0.0;
        fVar72 = 0.0;
        fVar75 = 0.0;
        fVar76 = 0.0;
        fVar77 = 0.0;
        fVar78 = 0.0;
      }
      else {
        ppvVar1 = &_bias->data + lVar63 * 4;
        fVar71 = *(float *)ppvVar1;
        fVar72 = *(float *)((long)ppvVar1 + 4);
        fVar73 = *(float *)(ppvVar1 + 1);
        fVar74 = *(float *)((long)ppvVar1 + 0xc);
        fVar75 = *(float *)(ppvVar1 + 2);
        fVar76 = *(float *)((long)ppvVar1 + 0x14);
        fVar77 = *(float *)(ppvVar1 + 3);
        fVar78 = *(float *)((long)ppvVar1 + 0x1c);
      }
      if (0 < iVar54) {
        pauVar61 = (undefined1 (*) [32])
                   (top_blob->cstep * lVar63 * top_blob->elemsize + (long)top_blob->data);
        lVar70 = kernel->w * lVar63 * kernel->elemsize;
        pvVar55 = kernel->data;
        pvVar67 = (void *)(bottom_blob->cstep * lVar63 * bottom_blob->elemsize +
                          (long)bottom_blob->data);
        lVar68 = (long)bottom_blob->w * bottom_blob->elemsize;
        pvVar62 = (void *)((long)pvVar67 + lVar68 * 4);
        pvVar59 = (void *)(lVar68 * 3 + (long)pvVar67);
        pvVar66 = (void *)((long)pvVar67 + lVar68 * 2);
        pvVar69 = (void *)(lVar68 + (long)pvVar67);
        iVar60 = 0;
        do {
          if (0 < iVar53) {
            lVar68 = 0;
            iVar64 = iVar53;
            do {
              pfVar2 = (float *)((long)pvVar55 + lVar70);
              pfVar6 = (float *)((long)pvVar55 + lVar70 + 0x20);
              pfVar7 = (float *)((long)pvVar55 + lVar70 + 0x40);
              pfVar8 = (float *)((long)pvVar55 + lVar70 + 0x60);
              pfVar26 = (float *)((long)pvVar55 + lVar70 + 0x80);
              pfVar3 = (float *)((long)pvVar67 + lVar68);
              pfVar9 = (float *)((long)pvVar67 + lVar68 + 0x20);
              pfVar10 = (float *)((long)pvVar67 + lVar68 + 0x40);
              fVar80 = pfVar6[7] + pfVar7[7];
              pfVar11 = (float *)((long)pvVar67 + lVar68 + 0x60);
              pfVar27 = (float *)((long)pvVar67 + lVar68 + 0x80);
              pfVar28 = (float *)((long)pvVar55 + lVar70 + 0xa0);
              fVar56 = pfVar28[7];
              pfVar29 = (float *)((long)pvVar55 + lVar70 + 0xc0);
              pfVar30 = (float *)((long)pvVar55 + lVar70 + 0xe0);
              pfVar31 = (float *)((long)pvVar55 + lVar70 + 0x100);
              pfVar32 = (float *)((long)pvVar55 + lVar70 + 0x120);
              pfVar24 = (float *)((long)pvVar69 + lVar68);
              fVar81 = fVar80 + pfVar7[7] + fVar56;
              pfVar12 = (float *)((long)pvVar69 + lVar68 + 0x20);
              pfVar13 = (float *)((long)pvVar69 + lVar68 + 0x40);
              pfVar14 = (float *)((long)pvVar69 + lVar68 + 0x60);
              pfVar33 = (float *)((long)pvVar69 + lVar68 + 0x80);
              pfVar34 = (float *)((long)pvVar55 + lVar70 + 0x140);
              pfVar35 = (float *)((long)pvVar55 + lVar70 + 0x160);
              fVar57 = pfVar35[7];
              pfVar36 = (float *)((long)pvVar55 + lVar70 + 0x180);
              pfVar37 = (float *)((long)pvVar55 + lVar70 + 0x1a0);
              pfVar4 = (float *)((long)pvVar66 + lVar68);
              pfVar15 = (float *)((long)pvVar66 + lVar68 + 0x20);
              pfVar38 = (float *)((long)pvVar55 + lVar70 + 0x1c0);
              pfVar16 = (float *)((long)pvVar66 + lVar68 + 0x40);
              pfVar17 = (float *)((long)pvVar66 + lVar68 + 0x60);
              pfVar39 = (float *)((long)pvVar66 + lVar68 + 0x80);
              pfVar40 = (float *)((long)pvVar55 + lVar70 + 0x1e0);
              pfVar41 = (float *)((long)pvVar55 + lVar70 + 0x200);
              fVar82 = pfVar41[7];
              pfVar42 = (float *)((long)pvVar55 + lVar70 + 0x220);
              pfVar43 = (float *)((long)pvVar55 + lVar70 + 0x240);
              pfVar5 = (float *)((long)pvVar59 + lVar68);
              pfVar18 = (float *)((long)pvVar59 + lVar68 + 0x20);
              pfVar44 = (float *)((long)pvVar55 + lVar70 + 0x260);
              pfVar19 = (float *)((long)pvVar59 + lVar68 + 0x40);
              pfVar20 = (float *)((long)pvVar59 + lVar68 + 0x60);
              pfVar45 = (float *)((long)pvVar59 + lVar68 + 0x80);
              pfVar46 = (float *)((long)pvVar55 + lVar70 + 0x280);
              fVar58 = pfVar46[7];
              auVar48 = *(undefined1 (*) [32])((long)pvVar55 + lVar70 + 0x2a0);
              auVar49 = *(undefined1 (*) [32])((long)pvVar55 + lVar70 + 0x2c0);
              auVar50 = *(undefined1 (*) [32])((long)pvVar55 + lVar70 + 0x2e0);
              auVar51 = *(undefined1 (*) [32])((long)pvVar55 + lVar70 + 0x300);
              pfVar25 = (float *)((long)pvVar62 + lVar68);
              fVar82 = pfVar40[7] + fVar82 + fVar82 + fVar82 + fVar82 + fVar58;
              pfVar21 = (float *)((long)pvVar62 + lVar68 + 0x20);
              pfVar22 = (float *)((long)pvVar62 + lVar68 + 0x40);
              pfVar23 = (float *)((long)pvVar62 + lVar68 + 0x60);
              pfVar47 = (float *)((long)pvVar62 + lVar68 + 0x80);
              auVar79._0_4_ =
                   *pfVar2 * *pfVar3 + fVar71 + *pfVar6 * *pfVar9 + *pfVar7 * *pfVar10 +
                   *pfVar8 * *pfVar11 + *pfVar26 * *pfVar27 + *pfVar28 * *pfVar24 +
                   *pfVar29 * *pfVar12 + *pfVar30 * *pfVar13 + *pfVar31 * *pfVar14 +
                   *pfVar32 * *pfVar33 +
                   *pfVar34 * *pfVar4 + *pfVar35 * *pfVar15 + *pfVar36 * *pfVar16 +
                   *pfVar37 * *pfVar17 + *pfVar38 * *pfVar39 +
                   *pfVar40 * *pfVar5 + *pfVar41 * *pfVar18 + *pfVar42 * *pfVar19 +
                   *pfVar43 * *pfVar20 + *pfVar44 * *pfVar45 + *pfVar46 * *pfVar25 +
                   auVar48._0_4_ * *pfVar21 + auVar49._0_4_ * *pfVar22 + auVar50._0_4_ * *pfVar23 +
                   auVar51._0_4_ * *pfVar47;
              auVar79._4_4_ =
                   pfVar2[1] * pfVar3[1] + fVar72 + pfVar6[1] * pfVar9[1] + pfVar7[1] * pfVar10[1] +
                   pfVar8[1] * pfVar11[1] + pfVar26[1] * pfVar27[1] + pfVar28[1] * pfVar24[1] +
                   pfVar29[1] * pfVar12[1] + pfVar30[1] * pfVar13[1] + pfVar31[1] * pfVar14[1] +
                   pfVar32[1] * pfVar33[1] +
                   pfVar34[1] * pfVar4[1] + pfVar35[1] * pfVar15[1] + pfVar36[1] * pfVar16[1] +
                   pfVar37[1] * pfVar17[1] + pfVar38[1] * pfVar39[1] +
                   pfVar40[1] * pfVar5[1] + pfVar41[1] * pfVar18[1] + pfVar42[1] * pfVar19[1] +
                   pfVar43[1] * pfVar20[1] + pfVar44[1] * pfVar45[1] + pfVar46[1] * pfVar25[1] +
                   auVar48._4_4_ * pfVar21[1] + auVar49._4_4_ * pfVar22[1] +
                   auVar50._4_4_ * pfVar23[1] + auVar51._4_4_ * pfVar47[1];
              auVar79._8_4_ =
                   pfVar2[2] * pfVar3[2] + fVar73 + pfVar6[2] * pfVar9[2] + pfVar7[2] * pfVar10[2] +
                   pfVar8[2] * pfVar11[2] + pfVar26[2] * pfVar27[2] + pfVar28[2] * pfVar24[2] +
                   pfVar29[2] * pfVar12[2] + pfVar30[2] * pfVar13[2] + pfVar31[2] * pfVar14[2] +
                   pfVar32[2] * pfVar33[2] +
                   pfVar34[2] * pfVar4[2] + pfVar35[2] * pfVar15[2] + pfVar36[2] * pfVar16[2] +
                   pfVar37[2] * pfVar17[2] + pfVar38[2] * pfVar39[2] +
                   pfVar40[2] * pfVar5[2] + pfVar41[2] * pfVar18[2] + pfVar42[2] * pfVar19[2] +
                   pfVar43[2] * pfVar20[2] + pfVar44[2] * pfVar45[2] + pfVar46[2] * pfVar25[2] +
                   auVar48._8_4_ * pfVar21[2] + auVar49._8_4_ * pfVar22[2] +
                   auVar50._8_4_ * pfVar23[2] + auVar51._8_4_ * pfVar47[2];
              auVar79._12_4_ =
                   pfVar2[3] * pfVar3[3] + fVar74 + pfVar6[3] * pfVar9[3] + pfVar7[3] * pfVar10[3] +
                   pfVar8[3] * pfVar11[3] + pfVar26[3] * pfVar27[3] + pfVar28[3] * pfVar24[3] +
                   pfVar29[3] * pfVar12[3] + pfVar30[3] * pfVar13[3] + pfVar31[3] * pfVar14[3] +
                   pfVar32[3] * pfVar33[3] +
                   pfVar34[3] * pfVar4[3] + pfVar35[3] * pfVar15[3] + pfVar36[3] * pfVar16[3] +
                   pfVar37[3] * pfVar17[3] + pfVar38[3] * pfVar39[3] +
                   pfVar40[3] * pfVar5[3] + pfVar41[3] * pfVar18[3] + pfVar42[3] * pfVar19[3] +
                   pfVar43[3] * pfVar20[3] + pfVar44[3] * pfVar45[3] + pfVar46[3] * pfVar25[3] +
                   auVar48._12_4_ * pfVar21[3] + auVar49._12_4_ * pfVar22[3] +
                   auVar50._12_4_ * pfVar23[3] + auVar51._12_4_ * pfVar47[3];
              auVar79._16_4_ =
                   pfVar2[4] * pfVar3[4] + fVar75 + pfVar6[4] * pfVar9[4] + pfVar7[4] * pfVar10[4] +
                   pfVar8[4] * pfVar11[4] + pfVar26[4] * pfVar27[4] + pfVar28[4] * pfVar24[4] +
                   pfVar29[4] * pfVar12[4] + pfVar30[4] * pfVar13[4] + pfVar31[4] * pfVar14[4] +
                   pfVar32[4] * pfVar33[4] +
                   pfVar34[4] * pfVar4[4] + pfVar35[4] * pfVar15[4] + pfVar36[4] * pfVar16[4] +
                   pfVar37[4] * pfVar17[4] + pfVar38[4] * pfVar39[4] +
                   pfVar40[4] * pfVar5[4] + pfVar41[4] * pfVar18[4] + pfVar42[4] * pfVar19[4] +
                   pfVar43[4] * pfVar20[4] + pfVar44[4] * pfVar45[4] + pfVar46[4] * pfVar25[4] +
                   auVar48._16_4_ * pfVar21[4] + auVar49._16_4_ * pfVar22[4] +
                   auVar50._16_4_ * pfVar23[4] + auVar51._16_4_ * pfVar47[4];
              auVar79._20_4_ =
                   pfVar2[5] * pfVar3[5] + fVar76 + pfVar6[5] * pfVar9[5] + pfVar7[5] * pfVar10[5] +
                   pfVar8[5] * pfVar11[5] + pfVar26[5] * pfVar27[5] + pfVar28[5] * pfVar24[5] +
                   pfVar29[5] * pfVar12[5] + pfVar30[5] * pfVar13[5] + pfVar31[5] * pfVar14[5] +
                   pfVar32[5] * pfVar33[5] +
                   pfVar34[5] * pfVar4[5] + pfVar35[5] * pfVar15[5] + pfVar36[5] * pfVar16[5] +
                   pfVar37[5] * pfVar17[5] + pfVar38[5] * pfVar39[5] +
                   pfVar40[5] * pfVar5[5] + pfVar41[5] * pfVar18[5] + pfVar42[5] * pfVar19[5] +
                   pfVar43[5] * pfVar20[5] + pfVar44[5] * pfVar45[5] + pfVar46[5] * pfVar25[5] +
                   auVar48._20_4_ * pfVar21[5] + auVar49._20_4_ * pfVar22[5] +
                   auVar50._20_4_ * pfVar23[5] + auVar51._20_4_ * pfVar47[5];
              auVar79._24_4_ =
                   pfVar2[6] * pfVar3[6] + fVar77 + pfVar6[6] * pfVar9[6] + pfVar7[6] * pfVar10[6] +
                   pfVar8[6] * pfVar11[6] + pfVar26[6] * pfVar27[6] + pfVar28[6] * pfVar24[6] +
                   pfVar29[6] * pfVar12[6] + pfVar30[6] * pfVar13[6] + pfVar31[6] * pfVar14[6] +
                   pfVar32[6] * pfVar33[6] +
                   pfVar34[6] * pfVar4[6] + pfVar35[6] * pfVar15[6] + pfVar36[6] * pfVar16[6] +
                   pfVar37[6] * pfVar17[6] + pfVar38[6] * pfVar39[6] +
                   pfVar40[6] * pfVar5[6] + pfVar41[6] * pfVar18[6] + pfVar42[6] * pfVar19[6] +
                   pfVar43[6] * pfVar20[6] + pfVar44[6] * pfVar45[6] + pfVar46[6] * pfVar25[6] +
                   auVar48._24_4_ * pfVar21[6] + auVar49._24_4_ * pfVar22[6] +
                   auVar50._24_4_ * pfVar23[6] + auVar51._24_4_ * pfVar47[6];
              auVar79._28_4_ =
                   pfVar2[7] + fVar78 + fVar80 + fVar81 + fVar81 + fVar56 + fVar56 + fVar56 +
                   pfVar34[7] + fVar57 + fVar57 + fVar57 + fVar57 + fVar82 +
                   fVar82 + fVar58 + fVar58 + fVar58;
              *pauVar61 = auVar79;
              pauVar61 = pauVar61 + 1;
              lVar68 = lVar68 + 0x40;
              iVar64 = iVar64 + -1;
            } while (iVar64 != 0);
            pvVar67 = (void *)((long)pvVar67 + lVar68);
            pvVar69 = (void *)((long)pvVar69 + lVar68);
            pvVar66 = (void *)((long)pvVar66 + lVar68);
            pvVar59 = (void *)((long)pvVar59 + lVar68);
            pvVar62 = (void *)((long)pvVar62 + lVar68);
          }
          pvVar67 = (void *)((long)pvVar67 + lVar65 * 4);
          pvVar69 = (void *)((long)pvVar69 + lVar65 * 4);
          pvVar66 = (void *)((long)pvVar66 + lVar65 * 4);
          pvVar59 = (void *)((long)pvVar59 + lVar65 * 4);
          pvVar62 = (void *)((long)pvVar62 + lVar65 * 4);
          iVar60 = iVar60 + 1;
        } while (iVar60 != iVar54);
      }
      lVar63 = lVar63 + 1;
    } while (lVar63 != iVar52);
  }
  return;
}

Assistant:

static void convdw5x5s2_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 8;

    const float* bias = _bias;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_set1_ps(0.f);

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        const float* r3 = img0.row(3);
        const float* r4 = img0.row(4);

        int i = 0;
        for (; i < outh; i++)
        {
            int j = 0;

            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);

                __m256 _k00 = _mm256_loadu_ps(k0);
                __m256 _k01 = _mm256_loadu_ps(k0 + 8);
                __m256 _k02 = _mm256_loadu_ps(k0 + 16);
                __m256 _k03 = _mm256_loadu_ps(k0 + 24);
                __m256 _k04 = _mm256_loadu_ps(k0 + 32);
                k0 += 40;

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);

                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);

                __m256 _k10 = _mm256_loadu_ps(k0);
                __m256 _k11 = _mm256_loadu_ps(k0 + 8);
                __m256 _k12 = _mm256_loadu_ps(k0 + 16);
                __m256 _k13 = _mm256_loadu_ps(k0 + 24);
                __m256 _k14 = _mm256_loadu_ps(k0 + 32);
                k0 += 40;

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);

                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);

                __m256 _k20 = _mm256_loadu_ps(k0);
                __m256 _k21 = _mm256_loadu_ps(k0 + 8);
                __m256 _k22 = _mm256_loadu_ps(k0 + 16);
                __m256 _k23 = _mm256_loadu_ps(k0 + 24);
                __m256 _k24 = _mm256_loadu_ps(k0 + 32);
                k0 += 40;

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k23, _r23, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k24, _r24, _sum0);

                __m256 _r30 = _mm256_loadu_ps(r3);
                __m256 _r31 = _mm256_loadu_ps(r3 + 8);
                __m256 _r32 = _mm256_loadu_ps(r3 + 16);
                __m256 _r33 = _mm256_loadu_ps(r3 + 24);
                __m256 _r34 = _mm256_loadu_ps(r3 + 32);

                __m256 _k30 = _mm256_loadu_ps(k0);
                __m256 _k31 = _mm256_loadu_ps(k0 + 8);
                __m256 _k32 = _mm256_loadu_ps(k0 + 16);
                __m256 _k33 = _mm256_loadu_ps(k0 + 24);
                __m256 _k34 = _mm256_loadu_ps(k0 + 32);
                k0 += 40;

                _sum0 = _mm256_comp_fmadd_ps(_k30, _r30, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k31, _r31, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k32, _r32, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k33, _r33, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k34, _r34, _sum0);

                __m256 _r40 = _mm256_loadu_ps(r4);
                __m256 _r41 = _mm256_loadu_ps(r4 + 8);
                __m256 _r42 = _mm256_loadu_ps(r4 + 16);
                __m256 _r43 = _mm256_loadu_ps(r4 + 24);
                __m256 _r44 = _mm256_loadu_ps(r4 + 32);

                __m256 _k40 = _mm256_loadu_ps(k0);
                __m256 _k41 = _mm256_loadu_ps(k0 + 8);
                __m256 _k42 = _mm256_loadu_ps(k0 + 16);
                __m256 _k43 = _mm256_loadu_ps(k0 + 24);
                __m256 _k44 = _mm256_loadu_ps(k0 + 32);
                k0 -= 160;

                _sum0 = _mm256_comp_fmadd_ps(_k40, _r40, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k41, _r41, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k42, _r42, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k43, _r43, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k44, _r44, _sum0);

                _mm256_storeu_ps(outptr0, _sum0);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                r3 += 16;
                r4 += 16;
                outptr0 += 8;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
            r3 += tailstep;
            r4 += tailstep;
        }
    }
}